

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

int __thiscall
glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine::init
          (shaderCollectionForSamplingRoutine *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  samplingFunction *in_RCX;
  long in_RDX;
  TextureCubeMapArraySamplingTest *in_R8;
  undefined1 local_130 [8];
  string sampling_vertex_shader_source;
  string sampling_tesselation_evaluation_shader_source;
  string sampling_tesselation_control_shader_source;
  string sampling_geometry_shader_source;
  string sampling_fragment_shader_source;
  string sampling_compute_shader_source;
  string pass_through_tesselation_control_shader_source;
  string pass_through_vertex_shader_source;
  TextureCubeMapArraySamplingTest *test_local;
  samplingFunction *sampling_function_local;
  formatDefinition *format_local;
  Functions *gl_local;
  shaderCollectionForSamplingRoutine *this_local;
  
  this->m_sampling_function = *in_RCX;
  std::__cxx11::string::string
            ((string *)(pass_through_tesselation_control_shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sampling_compute_shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sampling_fragment_shader_source.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::string((string *)(sampling_geometry_shader_source.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::string
            ((string *)(sampling_tesselation_control_shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(sampling_tesselation_evaluation_shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sampling_vertex_shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_130);
  getPassThroughVertexShaderCode
            (in_R8,(samplerType *)(in_RDX + 0x20),&this->m_sampling_function,
             (string *)(pass_through_tesselation_control_shader_source.field_2._M_local_buf + 8));
  getPassThroughTesselationControlShaderCode
            (in_R8,(samplerType *)(in_RDX + 0x20),&this->m_sampling_function,
             (string *)((long)&sampling_compute_shader_source.field_2 + 8));
  getSamplingComputeShaderCode
            (in_R8,(samplerType *)(in_RDX + 0x20),&this->m_sampling_function,
             (string *)((long)&sampling_fragment_shader_source.field_2 + 8));
  getSamplingFragmentShaderCode
            (in_R8,(samplerType *)(in_RDX + 0x20),&this->m_sampling_function,
             (string *)((long)&sampling_geometry_shader_source.field_2 + 8));
  getSamplingGeometryShaderCode
            (in_R8,(samplerType *)(in_RDX + 0x20),&this->m_sampling_function,
             (string *)((long)&sampling_tesselation_control_shader_source.field_2 + 8));
  getSamplingTesselationControlShaderCode
            (in_R8,(samplerType *)(in_RDX + 0x20),&this->m_sampling_function,
             (string *)((long)&sampling_tesselation_evaluation_shader_source.field_2 + 8));
  getSamplingTesselationEvaluationShaderCode
            (in_R8,(samplerType *)(in_RDX + 0x20),&this->m_sampling_function,
             (string *)((long)&sampling_vertex_shader_source.field_2 + 8));
  getSamplingVertexShaderCode
            (in_R8,(samplerType *)(in_RDX + 0x20),&this->m_sampling_function,(string *)local_130);
  shaderDefinition::init(&this->pass_through_vertex_shader,ctx);
  shaderDefinition::init(&this->sampling_compute_shader,ctx);
  shaderDefinition::init(&this->sampling_fragment_shader,ctx);
  shaderDefinition::init(&this->sampling_vertex_shader,ctx);
  compile(in_R8,&this->pass_through_vertex_shader);
  compile(in_R8,&this->sampling_compute_shader);
  compile(in_R8,&this->sampling_fragment_shader);
  compile(in_R8,&this->sampling_vertex_shader);
  if (((in_R8->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) != 0) {
    shaderDefinition::init(&this->pass_through_tesselation_control_shader,ctx);
    shaderDefinition::init(&this->sampling_tesselation_control_shader,ctx);
    shaderDefinition::init(&this->sampling_tesselation_evaluation_shader,ctx);
    compile(in_R8,&this->pass_through_tesselation_control_shader);
    compile(in_R8,&this->sampling_tesselation_control_shader);
    compile(in_R8,&this->sampling_tesselation_evaluation_shader);
  }
  if (((in_R8->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) != 0) {
    shaderDefinition::init(&this->sampling_geometry_shader,ctx);
    compile(in_R8,&this->sampling_geometry_shader);
  }
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)(sampling_vertex_shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::~string
            ((string *)(sampling_tesselation_evaluation_shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::~string
            ((string *)(sampling_tesselation_control_shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::~string
            ((string *)(sampling_geometry_shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::~string
            ((string *)(sampling_fragment_shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sampling_compute_shader_source.field_2._M_local_buf + 8))
  ;
  iVar1 = std::__cxx11::string::~string
                    ((string *)
                     (pass_through_tesselation_control_shader_source.field_2._M_local_buf + 8));
  return iVar1;
}

Assistant:

void TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine::init(
	const glw::Functions& gl, const formatDefinition& format, const samplingFunction& sampling_function,
	TextureCubeMapArraySamplingTest& test)
{
	m_sampling_function = sampling_function;

	std::string pass_through_vertex_shader_source;
	std::string pass_through_tesselation_control_shader_source;
	std::string sampling_compute_shader_source;
	std::string sampling_fragment_shader_source;
	std::string sampling_geometry_shader_source;
	std::string sampling_tesselation_control_shader_source;
	std::string sampling_tesselation_evaluation_shader_source;
	std::string sampling_vertex_shader_source;

	test.getPassThroughVertexShaderCode(format.m_sampler_type, m_sampling_function, pass_through_vertex_shader_source);

	test.getPassThroughTesselationControlShaderCode(format.m_sampler_type, m_sampling_function,
													pass_through_tesselation_control_shader_source);

	test.getSamplingComputeShaderCode(format.m_sampler_type, m_sampling_function, sampling_compute_shader_source);

	test.getSamplingFragmentShaderCode(format.m_sampler_type, m_sampling_function, sampling_fragment_shader_source);

	test.getSamplingGeometryShaderCode(format.m_sampler_type, m_sampling_function, sampling_geometry_shader_source);

	test.getSamplingTesselationControlShaderCode(format.m_sampler_type, m_sampling_function,
												 sampling_tesselation_control_shader_source);

	test.getSamplingTesselationEvaluationShaderCode(format.m_sampler_type, m_sampling_function,
													sampling_tesselation_evaluation_shader_source);

	test.getSamplingVertexShaderCode(format.m_sampler_type, m_sampling_function, sampling_vertex_shader_source);

	pass_through_vertex_shader.init(gl, GL_VERTEX_SHADER, pass_through_vertex_shader_source, &test);
	sampling_compute_shader.init(gl, GL_COMPUTE_SHADER, sampling_compute_shader_source, &test);
	sampling_fragment_shader.init(gl, GL_FRAGMENT_SHADER, sampling_fragment_shader_source, &test);
	sampling_vertex_shader.init(gl, GL_VERTEX_SHADER, sampling_vertex_shader_source, &test);

	test.compile(pass_through_vertex_shader);
	test.compile(sampling_compute_shader);
	test.compile(sampling_fragment_shader);
	test.compile(sampling_vertex_shader);

	if (test.m_is_tessellation_shader_supported)
	{
		pass_through_tesselation_control_shader.init(gl, test.m_glExtTokens.TESS_CONTROL_SHADER,
													 pass_through_tesselation_control_shader_source, &test);
		sampling_tesselation_control_shader.init(gl, test.m_glExtTokens.TESS_CONTROL_SHADER,
												 sampling_tesselation_control_shader_source, &test);
		sampling_tesselation_evaluation_shader.init(gl, test.m_glExtTokens.TESS_EVALUATION_SHADER,
													sampling_tesselation_evaluation_shader_source, &test);

		test.compile(pass_through_tesselation_control_shader);
		test.compile(sampling_tesselation_control_shader);
		test.compile(sampling_tesselation_evaluation_shader);
	}

	if (test.m_is_geometry_shader_extension_supported)
	{
		sampling_geometry_shader.init(gl, test.m_glExtTokens.GEOMETRY_SHADER, sampling_geometry_shader_source, &test);

		test.compile(sampling_geometry_shader);
	}
}